

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

void cf2_hintmap_build(CF2_HintMap hintmap,CF2_ArrStack hStemHintArray,CF2_ArrStack vStemHintArray,
                      CF2_HintMask hintMask,CF2_F16Dot16 hintOrigin,FT_Bool initialMap)

{
  int iVar1;
  CF2_Font font;
  int *piVar2;
  CF2_ArrStack pCVar3;
  void *pvVar4;
  undefined4 uVar5;
  uint uVar6;
  CF2_F16Dot16 *pCVar7;
  FT_Long FVar8;
  CF2_HintRec *pCVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  uint uVar20;
  undefined7 in_register_00000089;
  long lVar21;
  uint uVar22;
  size_t *psVar23;
  ulong uVar24;
  FT_Bool *pFVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auStack_e8 [8];
  CF2_HintMaskRec tempHintMask;
  undefined1 auStack_a8 [8];
  CF2_HintRec topHintEdge;
  undefined1 auStack_78 [8];
  CF2_HintRec dummy;
  
  iVar17 = (int)CONCAT71(in_register_00000089,initialMap);
  dummy._28_4_ = hintOrigin;
  font = hintmap->font;
  if ((iVar17 == 0) && (hintmap->initialHintMap->isValid == '\0')) {
    auStack_e8 = (undefined1  [8])hintMask->error;
    tempHintMask.error = (FT_Error *)0x0;
    tempHintMask.byteCount = 0;
    tempHintMask.mask[0] = '\0';
    tempHintMask.mask[1] = '\0';
    tempHintMask.mask[2] = '\0';
    tempHintMask.mask[3] = '\0';
    tempHintMask.mask[4] = '\0';
    tempHintMask.mask[5] = '\0';
    tempHintMask.mask[6] = '\0';
    tempHintMask.mask[7] = '\0';
    tempHintMask.isValid = '\0';
    tempHintMask.isNew = '\0';
    tempHintMask._10_6_ = 0;
    tempHintMask.bitCount = 0;
    cf2_hintmap_build(hintmap->initialHintMap,hStemHintArray,vStemHintArray,(CF2_HintMask)auStack_e8
                      ,hintOrigin,'\x01');
  }
  if (hintMask->isValid == '\0') {
    uVar12 = vStemHintArray->count + hStemHintArray->count;
    if (uVar12 < 0x61) {
      hintMask->bitCount = uVar12;
      hintMask->byteCount = uVar12 + 7 >> 3;
      hintMask->isValid = '\x01';
      hintMask->isNew = '\x01';
      if (uVar12 != 0) {
        uVar24 = 0;
        do {
          hintMask->mask[uVar24] = 0xff;
          uVar24 = uVar24 + 1;
        } while (uVar24 < hintMask->byteCount);
        hintMask->mask[hintMask->byteCount - 1] =
             hintMask->mask[hintMask->byteCount - 1] & -1 << (-(char)uVar12 & 7U);
      }
    }
    else {
      piVar2 = hintMask->error;
      if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
        *piVar2 = 0x12;
      }
    }
    if (hintMask->isValid == '\0') {
      if (font->isT1 == '\0') {
        return;
      }
      *hintMask->error = 0;
      pFVar25 = &hintmap->hinted;
      goto LAB_002120a1;
    }
  }
  hintmap->count = 0;
  hintmap->lastIndex = 0;
  auStack_e8 = (undefined1  [8])hintMask->error;
  tempHintMask.error = *(FT_Error **)&hintMask->isValid;
  tempHintMask._8_8_ = hintMask->bitCount;
  tempHintMask.bitCount = hintMask->byteCount;
  tempHintMask.byteCount = *(size_t *)hintMask->mask;
  tempHintMask.mask._0_8_ = *(undefined8 *)(hintMask->mask + 8);
  uVar12 = hStemHintArray->count;
  if (hintMask->bitCount < uVar12) {
    return;
  }
  dummy.scale = iVar17;
  if ((font->blues).doEmBoxHints != '\0') {
    dummy.index = 0;
    dummy.csCoord = 0;
    dummy.dsCoord = 0;
    auStack_78 = (undefined1  [8])0x0;
    dummy.flags = 0;
    dummy._4_4_ = 0;
    cf2_hintmap_insertHint(hintmap,&(font->blues).emBoxBottomEdge,(CF2_Hint)auStack_78);
    cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_78,&(font->blues).emBoxTopEdge);
  }
  if (uVar12 != 0) {
    tempHintMask._40_8_ = &(font->blues).zone[0].bottomZone;
    sVar14 = 0;
    psVar23 = &tempHintMask.byteCount;
    uVar22 = 0x80;
    do {
      uVar5 = dummy._28_4_;
      if ((uVar22 & (byte)*psVar23) != 0) {
        topHintEdge._24_8_ = psVar23;
        cf2_hint_init((CF2_Hint)auStack_78,hStemHintArray,sVar14,font,dummy._28_4_,hintmap->scale,
                      '\x01');
        psVar23 = (size_t *)topHintEdge._24_8_;
        cf2_hint_init((CF2_Hint)auStack_a8,hStemHintArray,sVar14,font,uVar5,hintmap->scale,'\0');
        if ((((ulong)auStack_78 & 0x10) == 0) && (((ulong)auStack_a8 & 0x10) == 0)) {
          uVar24 = (ulong)(font->blues).count;
          iVar17 = 0;
          bVar28 = uVar24 != 0;
          if (uVar24 == 0) {
            bVar27 = true;
          }
          else {
            iVar17 = (font->blues).blueFuzz;
            bVar28 = true;
            uVar15 = 1;
            pcVar19 = (char *)tempHintMask._40_8_;
            do {
              if (*pcVar19 == '\0') {
                if (((((ulong)auStack_a8 & 10) != 0) &&
                    (*(int *)(pcVar19 + -0x10) - iVar17 <= (int)topHintEdge.index)) &&
                   ((int)topHintEdge.index <= *(int *)(pcVar19 + -0xc) + iVar17)) {
                  if ((font->blues).suppressOvershoot == '\0') {
                    if ((int)topHintEdge.index - *(int *)(pcVar19 + -0x10) < (font->blues).blueShift
                       ) {
                      uVar16 = topHintEdge.index._4_4_ + 0x8000U & 0xffff0000;
                    }
                    else {
                      uVar6 = topHintEdge.index._4_4_ + 0x8000U & 0xffff0000;
                      uVar16 = *(int *)(pcVar19 + -4) + 0x10000U;
                      if ((int)(*(int *)(pcVar19 + -4) + 0x10000U) < (int)uVar6) {
                        uVar16 = uVar6;
                      }
                    }
                  }
                  else {
                    uVar16 = *(uint *)(pcVar19 + -4);
                  }
                  iVar17 = uVar16 - topHintEdge.index._4_4_;
                  goto LAB_00211bf0;
                }
              }
              else if (((((ulong)auStack_78 & 5) != 0) &&
                       (*(int *)(pcVar19 + -0x10) - iVar17 <= (int)dummy.index)) &&
                      ((int)dummy.index <= *(int *)(pcVar19 + -0xc) + iVar17)) {
                if ((font->blues).suppressOvershoot == '\0') {
                  if (*(int *)(pcVar19 + -0xc) - (int)dummy.index < (font->blues).blueShift) {
                    uVar16 = dummy.index._4_4_ + 0x8000U & 0xffff0000;
                  }
                  else {
                    uVar6 = dummy.index._4_4_ + 0x8000U & 0xffff0000;
                    uVar16 = *(int *)(pcVar19 + -4) - 0x10000U;
                    if ((int)uVar6 < (int)(*(int *)(pcVar19 + -4) - 0x10000U)) {
                      uVar16 = uVar6;
                    }
                  }
                }
                else {
                  uVar16 = *(uint *)(pcVar19 + -4);
                }
                iVar17 = uVar16 - dummy.index._4_4_;
LAB_00211bf0:
                bVar27 = false;
                goto LAB_00211bf2;
              }
              bVar28 = uVar15 < uVar24;
              pcVar19 = pcVar19 + 0x14;
              bVar27 = uVar15 != uVar24;
              uVar15 = uVar15 + 1;
            } while (bVar27);
            bVar27 = true;
            iVar17 = 0;
          }
LAB_00211bf2:
          if (bVar28) {
            if (auStack_78._0_4_ != 0) {
              dummy.index = CONCAT44(dummy.index._4_4_ + iVar17,(int)dummy.index);
              auStack_78 = (undefined1  [8])((ulong)auStack_78 | 0x10);
            }
            if (auStack_a8._0_4_ != 0) {
              topHintEdge.index = CONCAT44(topHintEdge.index._4_4_ + iVar17,(int)topHintEdge.index);
              auStack_a8 = (undefined1  [8])((ulong)auStack_a8 | 0x10);
            }
          }
          if (bVar27) goto LAB_00211c3c;
        }
        cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_78,(CF2_Hint)auStack_a8);
        *(byte *)psVar23 = *(byte *)psVar23 & ~(byte)uVar22;
      }
LAB_00211c3c:
      uVar22 = uVar22 >> 1;
      bVar28 = (~(uint)sVar14 & 7) == 0;
      if (bVar28) {
        uVar22 = 0x80;
      }
      psVar23 = (size_t *)((long)psVar23 + (ulong)bVar28);
      sVar14 = sVar14 + 1;
    } while (sVar14 != uVar12);
  }
  if ((char)dummy.scale == '\0') {
    psVar23 = &tempHintMask.byteCount;
    if (uVar12 != 0) {
      sVar14 = 0;
      uVar22 = 0x80;
      do {
        uVar5 = dummy._28_4_;
        if ((uVar22 & (byte)*psVar23) != 0) {
          cf2_hint_init((CF2_Hint)auStack_78,hStemHintArray,sVar14,font,dummy._28_4_,hintmap->scale,
                        '\x01');
          cf2_hint_init((CF2_Hint)auStack_a8,hStemHintArray,sVar14,font,uVar5,hintmap->scale,'\0');
          cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_78,(CF2_Hint)auStack_a8);
        }
        uVar22 = uVar22 >> 1;
        bVar28 = (~(uint)sVar14 & 7) == 0;
        if (bVar28) {
          uVar22 = 0x80;
        }
        psVar23 = (size_t *)((long)psVar23 + (ulong)bVar28);
        sVar14 = sVar14 + 1;
      } while (uVar12 != sVar14);
    }
  }
  else if (((hintmap->count == 0) || (0 < hintmap->edge[0].csCoord)) ||
          (hintmap->edge[hintmap->count - 1].csCoord < 0)) {
    dummy.flags = 0;
    dummy._4_4_ = 0;
    dummy.index = 0;
    auStack_78 = (undefined1  [8])0x31;
    dummy.dsCoord = 0;
    dummy.csCoord = hintmap->scale;
    auStack_a8 = (undefined1  [8])0x0;
    topHintEdge.flags = 0;
    topHintEdge._4_4_ = 0;
    topHintEdge.index = 0;
    topHintEdge.csCoord = 0;
    topHintEdge.dsCoord = 0;
    cf2_hintmap_insertHint(hintmap,(CF2_Hint)auStack_78,(CF2_Hint)auStack_a8);
  }
  hintmap->hintMoves->count = 0;
  uVar12 = (ulong)hintmap->count;
  if (hintmap->count != 0) {
    uVar24 = 0;
    do {
      uVar22 = hintmap->edge[uVar24].flags;
      uVar15 = uVar24 + 1;
      uVar26 = uVar24;
      if ((uVar22 & 0xc) != 0) {
        uVar26 = uVar15;
      }
      if ((uVar22 & 0x10) == 0) {
        uVar16 = hintmap->edge[uVar24].dsCoord;
        uVar18 = uVar16 & 0xffff;
        uVar6 = hintmap->edge[uVar26].dsCoord;
        uVar11 = uVar6 & 0xffff;
        uVar20 = 0x10000 - uVar18;
        if (uVar18 == 0) {
          uVar20 = 0;
        }
        uVar10 = 0x10000 - uVar11;
        if (uVar11 == 0) {
          uVar10 = 0;
        }
        if (uVar20 < uVar10) {
          uVar10 = uVar20;
        }
        if (uVar18 < uVar11) {
          uVar11 = uVar18;
        }
        uVar12 = (ulong)((int)uVar12 - 1);
        if ((uVar26 < uVar12) &&
           (hintmap->edge[uVar26 + 1].dsCoord < (int)(uVar6 + uVar10 + 0x8000))) {
          if (uVar24 != 0) {
            bVar28 = false;
            uVar6 = 0;
            if ((int)((uVar16 - uVar11) + -0x8000) < hintmap->edge[uVar24 - 1].dsCoord)
            goto LAB_00211eb3;
          }
          bVar28 = uVar11 <= uVar10;
          uVar6 = -uVar11;
        }
        else if ((uVar24 == 0) ||
                (bVar28 = true, uVar6 = uVar10,
                hintmap->edge[uVar24 - 1].dsCoord <= (int)((uVar16 - uVar11) + -0x8000))) {
          uVar6 = -uVar11;
          if (uVar10 <= uVar11) {
            uVar6 = uVar10;
          }
          bVar28 = true;
        }
LAB_00211eb3:
        if (((uVar26 < uVar12) && (!bVar28)) && ((hintmap->edge[uVar26 + 1].flags & 0x10) == 0)) {
          dummy.flags = uVar10 - uVar6;
          topHintEdge.scale = uVar6;
          auStack_78 = (undefined1  [8])uVar26;
          cf2_arrstack_push(hintmap->hintMoves,auStack_78);
          uVar6 = topHintEdge.scale;
        }
        pCVar7 = &hintmap->edge[uVar24].dsCoord;
        *pCVar7 = *pCVar7 + uVar6;
        if ((uVar22 & 0xc) != 0) {
          pCVar7 = &hintmap->edge[uVar26].dsCoord;
          *pCVar7 = *pCVar7 + uVar6;
        }
      }
      if ((uVar24 != 0) &&
         (iVar17 = hintmap->edge[uVar24].csCoord - hintmap->edge[uVar24 - 1].csCoord, iVar17 != 0))
      {
        FVar8 = FT_DivFix((long)(hintmap->edge[uVar24].dsCoord - hintmap->edge[uVar24 - 1].dsCoord),
                          (long)iVar17);
        hintmap->edge[uVar24 - 1].scale = (CF2_F16Dot16)FVar8;
      }
      if (((uVar22 & 0xc) != 0) &&
         (iVar17 = hintmap->edge[uVar26].csCoord - hintmap->edge[uVar26 - 1].csCoord,
         uVar24 = uVar15, iVar17 != 0)) {
        FVar8 = FT_DivFix((long)(hintmap->edge[uVar26].dsCoord - hintmap->edge[uVar26 - 1].dsCoord),
                          (long)iVar17);
        hintmap->edge[uVar26 - 1].scale = (CF2_F16Dot16)FVar8;
      }
      uVar24 = uVar24 + 1;
      uVar12 = (ulong)hintmap->count;
    } while (uVar24 < uVar12);
  }
  pCVar3 = hintmap->hintMoves;
  uVar12 = pCVar3->count;
  if (uVar12 != 0) {
    sVar14 = pCVar3->sizeItem;
    pvVar4 = pCVar3->ptr;
    uVar24 = uVar12;
    do {
      uVar24 = uVar24 - 1;
      uVar15 = uVar24;
      if (uVar12 <= uVar24) {
        piVar2 = pCVar3->error;
        if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
          *piVar2 = 0x82;
        }
        uVar15 = 0;
      }
      lVar21 = uVar15 * sVar14;
      lVar13 = *(long *)((long)pvVar4 + lVar21);
      iVar17 = hintmap->edge[lVar13].dsCoord;
      iVar1 = *(int *)((long)pvVar4 + lVar21 + 8);
      if ((iVar1 + iVar17 + 0x8000 <= hintmap->edge[lVar13 + 1].dsCoord) &&
         (hintmap->edge[lVar13].dsCoord = iVar17 + iVar1, (hintmap->edge[lVar13].flags & 0xc) != 0))
      {
        pCVar7 = &hintmap->edge[lVar13 + -1].dsCoord;
        *pCVar7 = *pCVar7 + iVar1;
      }
    } while (uVar24 != 0);
  }
  if (((char)dummy.scale == '\0') && (hintmap->count != 0)) {
    pCVar9 = hintmap->edge;
    uVar12 = 0;
    do {
      if ((pCVar9->flags & 0x20) == 0) {
        uVar24 = pCVar9->index;
        if (hStemHintArray->count <= uVar24) {
          piVar2 = hStemHintArray->error;
          if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
            *piVar2 = 0x82;
          }
          uVar24 = 0;
        }
        pvVar4 = hStemHintArray->ptr;
        lVar13 = uVar24 * hStemHintArray->sizeItem;
        *(CF2_F16Dot16 *)((long)pvVar4 + (ulong)((pCVar9->flags & 10) != 0) * 4 + lVar13 + 0xc) =
             pCVar9->dsCoord;
        *(undefined1 *)((long)pvVar4 + lVar13) = 1;
      }
      uVar12 = uVar12 + 1;
      pCVar9 = pCVar9 + 1;
    } while (uVar12 < hintmap->count);
  }
  hintmap->isValid = '\x01';
  pFVar25 = &hintMask->isNew;
LAB_002120a1:
  *pFVar25 = '\0';
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_hintmap_build( CF2_HintMap   hintmap,
                     CF2_ArrStack  hStemHintArray,
                     CF2_ArrStack  vStemHintArray,
                     CF2_HintMask  hintMask,
                     CF2_Fixed     hintOrigin,
                     FT_Bool       initialMap )
  {
    FT_Byte*  maskPtr;

    CF2_Font         font = hintmap->font;
    CF2_HintMaskRec  tempHintMask;

    size_t   bitCount, i;
    FT_Byte  maskByte;


    /* check whether initial map is constructed */
    if ( !initialMap && !cf2_hintmap_isValid( hintmap->initialHintMap ) )
    {
      /* make recursive call with initialHintMap and temporary mask; */
      /* temporary mask will get all bits set, below */
      cf2_hintmask_init( &tempHintMask, hintMask->error );
      cf2_hintmap_build( hintmap->initialHintMap,
                         hStemHintArray,
                         vStemHintArray,
                         &tempHintMask,
                         hintOrigin,
                         TRUE );
    }

    if ( !cf2_hintmask_isValid( hintMask ) )
    {
      /* without a hint mask, assume all hints are active */
      cf2_hintmask_setAll( hintMask,
                           cf2_arrstack_size( hStemHintArray ) +
                             cf2_arrstack_size( vStemHintArray ) );
      if ( !cf2_hintmask_isValid( hintMask ) )
      {
        if ( font->isT1 )
        {
          /* no error, just continue unhinted */
          *hintMask->error = FT_Err_Ok;
          hintmap->hinted  = FALSE;
        }
        return;                   /* too many stem hints */
      }
    }

    /* begin by clearing the map */
    hintmap->count     = 0;
    hintmap->lastIndex = 0;

    /* make a copy of the hint mask so we can modify it */
    tempHintMask = *hintMask;
    maskPtr      = cf2_hintmask_getMaskPtr( &tempHintMask );

    /* use the hStem hints only, which are first in the mask */
    bitCount = cf2_arrstack_size( hStemHintArray );

    /* Defense-in-depth.  Should never return here. */
    if ( bitCount > hintMask->bitCount )
      return;

    /* synthetic embox hints get highest priority */
    if ( font->blues.doEmBoxHints )
    {
      CF2_HintRec  dummy;


      cf2_hint_initZero( &dummy );   /* invalid hint map element */

      /* ghost bottom */
      cf2_hintmap_insertHint( hintmap,
                              &font->blues.emBoxBottomEdge,
                              &dummy );
      /* ghost top */
      cf2_hintmap_insertHint( hintmap,
                              &dummy,
                              &font->blues.emBoxTopEdge );
    }

    /* insert hints captured by a blue zone or already locked (higher */
    /* priority)                                                      */
    for ( i = 0, maskByte = 0x80; i < bitCount; i++ )
    {
      if ( maskByte & *maskPtr )
      {
        /* expand StemHint into two `CF2_Hint' elements */
        CF2_HintRec  bottomHintEdge, topHintEdge;


        cf2_hint_init( &bottomHintEdge,
                       hStemHintArray,
                       i,
                       font,
                       hintOrigin,
                       hintmap->scale,
                       TRUE /* bottom */ );
        cf2_hint_init( &topHintEdge,
                       hStemHintArray,
                       i,
                       font,
                       hintOrigin,
                       hintmap->scale,
                       FALSE /* top */ );

        if ( cf2_hint_isLocked( &bottomHintEdge ) ||
             cf2_hint_isLocked( &topHintEdge )    ||
             cf2_blues_capture( &font->blues,
                                &bottomHintEdge,
                                &topHintEdge )   )
        {
          /* insert captured hint into map */
          cf2_hintmap_insertHint( hintmap, &bottomHintEdge, &topHintEdge );

          *maskPtr &= ~maskByte;      /* turn off the bit for this hint */
        }
      }

      if ( ( i & 7 ) == 7 )
      {
        /* move to next mask byte */
        maskPtr++;
        maskByte = 0x80;
      }
      else
        maskByte >>= 1;
    }

    /* initial hint map includes only captured hints plus maybe one at 0 */

    /*
     * TODO: There is a problem here because we are trying to build a
     *       single hint map containing all captured hints.  It is
     *       possible for there to be conflicts between captured hints,
     *       either because of darkening or because the hints are in
     *       separate hint zones (we are ignoring hint zones for the
     *       initial map).  An example of the latter is MinionPro-Regular
     *       v2.030 glyph 883 (Greek Capital Alpha with Psili) at 15ppem.
     *       A stem hint for the psili conflicts with the top edge hint
     *       for the base character.  The stem hint gets priority because
     *       of its sort order.  In glyph 884 (Greek Capital Alpha with
     *       Psili and Oxia), the top of the base character gets a stem
     *       hint, and the psili does not.  This creates different initial
     *       maps for the two glyphs resulting in different renderings of
     *       the base character.  Will probably defer this either as not
     *       worth the cost or as a font bug.  I don't think there is any
     *       good reason for an accent to be captured by an alignment
     *       zone.  -darnold 2/12/10
     */

    if ( initialMap )
    {
      /* Apply a heuristic that inserts a point for (0,0), unless it's     */
      /* already covered by a mapping.  This locks the baseline for glyphs */
      /* that have no baseline hints.                                      */

      if ( hintmap->count == 0                           ||
           hintmap->edge[0].csCoord > 0                  ||
           hintmap->edge[hintmap->count - 1].csCoord < 0 )
      {
        /* all edges are above 0 or all edges are below 0; */
        /* construct a locked edge hint at 0               */

        CF2_HintRec  edge, invalid;


        cf2_hint_initZero( &edge );

        edge.flags = CF2_GhostBottom |
                     CF2_Locked      |
                     CF2_Synthetic;
        edge.scale = hintmap->scale;

        cf2_hint_initZero( &invalid );
        cf2_hintmap_insertHint( hintmap, &edge, &invalid );
      }
    }
    else
    {
      /* insert remaining hints */

      maskPtr = cf2_hintmask_getMaskPtr( &tempHintMask );

      for ( i = 0, maskByte = 0x80; i < bitCount; i++ )
      {
        if ( maskByte & *maskPtr )
        {
          CF2_HintRec  bottomHintEdge, topHintEdge;


          cf2_hint_init( &bottomHintEdge,
                         hStemHintArray,
                         i,
                         font,
                         hintOrigin,
                         hintmap->scale,
                         TRUE /* bottom */ );
          cf2_hint_init( &topHintEdge,
                         hStemHintArray,
                         i,
                         font,
                         hintOrigin,
                         hintmap->scale,
                         FALSE /* top */ );

          cf2_hintmap_insertHint( hintmap, &bottomHintEdge, &topHintEdge );
        }

        if ( ( i & 7 ) == 7 )
        {
          /* move to next mask byte */
          maskPtr++;
          maskByte = 0x80;
        }
        else
          maskByte >>= 1;
      }
    }

    FT_TRACE6(( initialMap ? "flags: [p]air [g]host [t]op "
                             "[b]ottom [L]ocked [S]ynthetic\n"
                             "Initial hintmap\n"
                           : "Hints:\n" ));
    cf2_hintmap_dump( hintmap );

    /*
     * Note: The following line is a convenient place to break when
     *       debugging hinting.  Examine `hintmap->edge' for the list of
     *       enabled hints, then step over the call to see the effect of
     *       adjustment.  We stop here first on the recursive call that
     *       creates the initial map, and then on each counter group and
     *       hint zone.
     */

    /* adjust positions of hint edges that are not locked to blue zones */
    cf2_hintmap_adjustHints( hintmap );

    FT_TRACE6(( "(adjusted)\n" ));
    cf2_hintmap_dump( hintmap );

    /* save the position of all hints that were used in this hint map; */
    /* if we use them again, we'll locate them in the same position    */
    if ( !initialMap )
    {
      for ( i = 0; i < hintmap->count; i++ )
      {
        if ( !cf2_hint_isSynthetic( &hintmap->edge[i] ) )
        {
          /* Note: include both valid and invalid edges            */
          /* Note: top and bottom edges are copied back separately */
          CF2_StemHint  stemhint = (CF2_StemHint)
                          cf2_arrstack_getPointer( hStemHintArray,
                                                   hintmap->edge[i].index );


          if ( cf2_hint_isTop( &hintmap->edge[i] ) )
            stemhint->maxDS = hintmap->edge[i].dsCoord;
          else
            stemhint->minDS = hintmap->edge[i].dsCoord;

          stemhint->used = TRUE;
        }
      }
    }

    /* hint map is ready to use */
    hintmap->isValid = TRUE;

    /* remember this mask has been used */
    cf2_hintmask_setNew( hintMask, FALSE );
  }